

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_Expression * __thiscall
ZCCCompiler::NodeFromSymbol
          (ZCCCompiler *this,PSymbol *sym,ZCC_Expression *source,PSymbolTable *table)

{
  PSymbolTable *pPVar1;
  bool bVar2;
  PSymbolTable *prevtable;
  PSymbolTable *table_local;
  ZCC_Expression *source_local;
  PSymbol *sym_local;
  ZCCCompiler *this_local;
  
  if (sym == (PSymbol *)0x0) {
    __assert_fail("sym != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0x232,
                  "ZCC_Expression *ZCCCompiler::NodeFromSymbol(PSymbol *, ZCC_Expression *, PSymbolTable *)"
                 );
  }
  bVar2 = DObject::IsA(&sym->super_DObject,PSymbolTreeNode::RegistrationInfo.MyClass);
  source_local = (ZCC_Expression *)sym;
  if (bVar2) {
    pPVar1 = this->Symbols;
    this->Symbols = table;
    source_local = (ZCC_Expression *)
                   CompileNode(this,(ZCC_NamedNode *)sym[1].super_DObject._vptr_DObject);
    this->Symbols = pPVar1;
    if (source_local == (ZCC_Expression *)0x0) {
      return (ZCC_Expression *)0x0;
    }
  }
  bVar2 = DObject::IsKindOf((DObject *)source_local,PSymbolConst::RegistrationInfo.MyClass);
  if (bVar2) {
    this_local = (ZCCCompiler *)NodeFromSymbolConst(this,(PSymbolConst *)source_local,source);
  }
  else {
    bVar2 = DObject::IsKindOf((DObject *)source_local,PSymbolType::RegistrationInfo.MyClass);
    if (bVar2) {
      this_local = (ZCCCompiler *)NodeFromSymbolType(this,(PSymbolType *)source_local,source);
    }
    else {
      this_local = (ZCCCompiler *)0x0;
    }
  }
  return (ZCC_Expression *)this_local;
}

Assistant:

ZCC_Expression *ZCCCompiler::NodeFromSymbol(PSymbol *sym, ZCC_Expression *source, PSymbolTable *table)
{
	assert(sym != NULL);
	if (sym->IsA(RUNTIME_CLASS(PSymbolTreeNode)))
	{
		PSymbolTable *prevtable = Symbols;
		Symbols = table;
		sym = CompileNode(static_cast<PSymbolTreeNode *>(sym)->Node);
		Symbols = prevtable;
		if (sym == NULL)
		{
			return NULL;
		}
	}
	if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
	{
		return NodeFromSymbolConst(static_cast<PSymbolConst *>(sym), source);
	}
	else if (sym->IsKindOf(RUNTIME_CLASS(PSymbolType)))
	{
		return NodeFromSymbolType(static_cast<PSymbolType *>(sym), source);
	}
	return NULL;
}